

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

bool nlohmann::json_abi_v3_11_2::operator==(const_reference lhs,const_reference rhs)

{
  value_t vVar1;
  value_t vVar2;
  double dVar3;
  __type_conflict1 _Var4;
  bool bVar5;
  
  vVar1 = lhs->m_type;
  vVar2 = rhs->m_type;
  if (vVar1 == vVar2) {
    switch(vVar1) {
    case null:
      bVar5 = true;
      break;
    case object:
      bVar5 = std::operator==(&((lhs->m_value).object)->_M_t,&((rhs->m_value).object)->_M_t);
      break;
    case array:
      bVar5 = std::operator==((vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                               *)(lhs->m_value).object,
                              (vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                               *)(rhs->m_value).object);
      break;
    case string:
      _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (lhs->m_value).object,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (rhs->m_value).object);
      return _Var4;
    case boolean:
      bVar5 = (lhs->m_value).boolean == (rhs->m_value).boolean;
      break;
    case number_integer:
    case number_unsigned:
switchD_0012ea1b_caseD_5:
      bVar5 = (lhs->m_value).object == (rhs->m_value).object;
      break;
    case number_float:
      dVar3 = (rhs->m_value).number_float;
LAB_0012eaec:
      bVar5 = dVar3 == (lhs->m_value).number_float;
      goto LAB_0012eaf7;
    case binary:
      bVar5 = byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator==((byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)(lhs->m_value).object,
                           (byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)(rhs->m_value).object);
      break;
    default:
      bVar5 = false;
    }
  }
  else {
    if (vVar1 == number_integer && (vVar2 ^ number_float) == null) {
      bVar5 = (double)(lhs->m_value).number_integer == (rhs->m_value).number_float;
    }
    else {
      if (vVar1 == number_float && (vVar2 ^ number_integer) == null) {
        dVar3 = (double)(rhs->m_value).number_integer;
        goto LAB_0012eaec;
      }
      if (vVar1 == number_unsigned && (vVar2 ^ number_float) == null) {
        bVar5 = ((double)CONCAT44(0x45300000,(int)((ulong)(lhs->m_value).number_integer >> 0x20)) -
                1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)(lhs->m_value).number_integer) -
                4503599627370496.0) == (rhs->m_value).number_float;
      }
      else {
        if (vVar1 != number_float || (vVar2 ^ number_unsigned) != null) {
          if ((vVar1 != number_unsigned || (vVar2 ^ number_integer) != null) &&
             (vVar1 != number_integer || (vVar2 ^ number_unsigned) != null)) {
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::compares_unordered(lhs,rhs,false);
            return false;
          }
          goto switchD_0012ea1b_caseD_5;
        }
        bVar5 = ((double)CONCAT44(0x45300000,(int)((ulong)(rhs->m_value).number_integer >> 0x20)) -
                1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)(rhs->m_value).number_integer) -
                4503599627370496.0) == (lhs->m_value).number_float;
      }
    }
LAB_0012eaf7:
    bVar5 = (bool)(-bVar5 & 1);
  }
  return bVar5;
}

Assistant:

constexpr value_t type() const noexcept
    {
        return m_type;
    }